

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void rc::detail::checkGTest<void(*)()>(_func_void **testable)

{
  bool bVar1;
  UnitTest *this;
  char *pcVar2;
  SuccessResult *pSVar3;
  Message *pMVar4;
  TestMetadata *in_RCX;
  AssertHelper local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  Message local_390;
  ostringstream local_388 [8];
  ostringstream ss;
  undefined1 local_210 [8];
  SuccessResult success;
  TestResult result;
  string local_110 [39];
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c5 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  TestMetadata metadata;
  TestInfo *testInfo;
  _func_void **testable_local;
  
  this = testing::UnitTest::GetInstance();
  metadata.description.field_2._8_8_ = testing::UnitTest::current_test_info(this);
  TestMetadata::TestMetadata((TestMetadata *)local_58);
  pcVar2 = testing::TestInfo::test_case_name((TestInfo *)metadata.description.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar2,local_c5);
  std::operator+(&local_98,&local_b8,"/");
  pcVar2 = testing::TestInfo::name((TestInfo *)metadata.description.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar2,&local_e9);
  std::operator+(&local_78,&local_98,&local_e8);
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(local_c5);
  pcVar2 = testing::TestInfo::name((TestInfo *)metadata.description.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,pcVar2,(allocator<char> *)(result.m_storage.__data + 0xb7));
  std::__cxx11::string::operator=((string *)(metadata.id.field_2._M_local_buf + 8),local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)(result.m_storage.__data + 0xb7));
  checkTestable<void(*)(),rc::detail::TestMetadata&>
            ((TestResult *)&success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (detail *)testable,(_func_void **)local_58,in_RCX);
  bVar1 = Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
          ::is<rc::detail::SuccessResult>
                    ((Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
                      *)&success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    pSVar3 = Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
             ::get<rc::detail::SuccessResult>
                       ((Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
                         *)&success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count);
    SuccessResult::SuccessResult((SuccessResult *)local_210,pSVar3);
    bVar1 = std::
            map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
            ::empty((map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
                     *)&success);
    if (!bVar1) {
      printResultMessage((TestResult *)
                         &success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ostream *)&std::cout);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    SuccessResult::~SuccessResult((SuccessResult *)local_210);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_388);
    printResultMessage((TestResult *)
                       &success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (ostream *)local_388);
    testing::Message::Message(&local_390);
    std::__cxx11::ostringstream::str();
    pMVar4 = testing::Message::operator<<(&local_390,&local_3b0);
    pMVar4 = testing::Message::operator<<(pMVar4,std::endl<char,std::char_traits<char>>);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/rapidcheck/extras/gtest/include/rapidcheck/gtest.h"
               ,0x1d,"Failed");
    testing::internal::AssertHelper::operator=(&local_3b8,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b0);
    testing::Message::~Message(&local_390);
    std::__cxx11::ostringstream::~ostringstream(local_388);
  }
  Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
  ::~Variant((Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
              *)&success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count);
  TestMetadata::~TestMetadata((TestMetadata *)local_58);
  return;
}

Assistant:

void checkGTest(Testable &&testable) {
  const auto testInfo = ::testing::UnitTest::GetInstance()->current_test_info();
  TestMetadata metadata;
  metadata.id = std::string(testInfo->test_case_name()) + "/" +
      std::string(testInfo->name());
  metadata.description = std::string(testInfo->name());

  const auto result = checkTestable(std::forward<Testable>(testable), metadata);

  if (result.template is<SuccessResult>()) {
    const auto success = result.template get<SuccessResult>();
    if (!success.distribution.empty()) {
      printResultMessage(result, std::cout);
      std::cout << std::endl;
    }
  } else {
    std::ostringstream ss;
    printResultMessage(result, ss);
    FAIL() << ss.str() << std::endl;
  }
}